

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O0

ShaderType deqp::gles31::Functional::getProgramTransformFeedbackStage(Program *program)

{
  bool bVar1;
  Program *program_local;
  
  bVar1 = ProgramInterfaceDefinition::Program::hasStage(program,SHADERTYPE_GEOMETRY);
  if (bVar1) {
    program_local._4_4_ = SHADERTYPE_GEOMETRY;
  }
  else {
    bVar1 = ProgramInterfaceDefinition::Program::hasStage
                      (program,SHADERTYPE_TESSELLATION_EVALUATION);
    if (bVar1) {
      program_local._4_4_ = SHADERTYPE_TESSELLATION_EVALUATION;
    }
    else {
      bVar1 = ProgramInterfaceDefinition::Program::hasStage(program,SHADERTYPE_VERTEX);
      if (bVar1) {
        program_local._4_4_ = SHADERTYPE_VERTEX;
      }
      else {
        program_local._4_4_ = SHADERTYPE_LAST;
      }
    }
  }
  return program_local._4_4_;
}

Assistant:

glu::ShaderType getProgramTransformFeedbackStage (const ProgramInterfaceDefinition::Program* program)
{
	if (program->hasStage(glu::SHADERTYPE_GEOMETRY))
		return glu::SHADERTYPE_GEOMETRY;

	if (program->hasStage(glu::SHADERTYPE_TESSELLATION_EVALUATION))
		return glu::SHADERTYPE_TESSELLATION_EVALUATION;

	if (program->hasStage(glu::SHADERTYPE_VERTEX))
		return glu::SHADERTYPE_VERTEX;

	DE_ASSERT(false);
	return glu::SHADERTYPE_LAST;
}